

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O0

void __thiscall
afsm::actions::detail::
action_invocation<afsm::test::transit_action,afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>,afsm::state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>>
::operator()(action_invocation<afsm::test::transit_action,afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>,afsm::state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>>
             *this,command_complete *event,
            inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
            *fsm,state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                 *source,
            state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
            *target)

{
  action_invocation_impl<afsm::test::transit_action,_afsm::test::events::command_complete,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_true>
  local_31;
  state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
  *local_30;
  state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
  *target_local;
  state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
  *source_local;
  inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
  *fsm_local;
  command_complete *event_local;
  action_invocation<afsm::test::transit_action,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_>
  *this_local;
  
  local_30 = target;
  target_local = source;
  source_local = (state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                  *)fsm;
  fsm_local = (inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
               *)event;
  event_local = (command_complete *)this;
  action_invocation_impl<afsm::test::transit_action,_afsm::test::events::command_complete,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_true>
  ::operator()(&local_31,event,fsm,source,target);
  return;
}

Assistant:

void
    operator()(Event&& event, FSM& fsm, SourceState& source, TargetState& target) const
    {
        using invocation_type = action_invocation_impl<
                                    Action, Event, FSM,
                                    SourceState, TargetState,
                                    action_long_signature<Action, Event, FSM,
                                            SourceState, TargetState>::value>;
        invocation_type{}(::std::forward<Event>(event), fsm, source, target);
    }